

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smc.cpp
# Opt level: O0

void __thiscall SMC::SMC(SMC *this,Structure *nativeConf,Params *params)

{
  const_reference pvVar1;
  value_type local_130;
  value_type local_12c;
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [39];
  allocator local_51;
  string local_50 [48];
  Params *local_20;
  Params *params_local;
  Structure *nativeConf_local;
  SMC *this_local;
  
  local_20 = params;
  params_local = (Params *)nativeConf;
  nativeConf_local = (Structure *)this;
  Structure::Structure(&this->Conf,1);
  Structure::Structure(&this->_conf,1);
  std::vector<Structure,_std::allocator<Structure>_>::vector(&this->LoopStore);
  std::
  vector<std::vector<Structure,_std::allocator<Structure>_>,_std::allocator<std::vector<Structure,_std::allocator<Structure>_>_>_>
  ::vector(&this->MultiLooplib);
  std::__cxx11::string::string((string *)&this->prot_name);
  std::vector<int,_std::allocator<int>_>::vector(&this->Reslist);
  std::vector<int,_std::allocator<int>_>::vector(&this->starts);
  std::vector<int,_std::allocator<int>_>::vector(&this->ends);
  CollisionFrontend::CollisionFrontend(&this->cfe);
  this->NumClosedconf = 0;
  Structure::init(&this->Conf,(EVP_PKEY_CTX *)(ulong)(uint)params_local->num_conf);
  Structure::init(&this->_conf,(EVP_PKEY_CTX *)(ulong)(uint)params_local->num_conf);
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&local_20->starts,0);
  if (*pvVar1 == -1) {
    local_12c = 1;
  }
  else {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&local_20->starts,0);
    local_12c = *pvVar1;
  }
  this->start = local_12c;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&local_20->ends,0);
  if (*pvVar1 == -1) {
    local_130 = params_local->num_conf;
  }
  else {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&local_20->ends,0);
    local_130 = *pvVar1;
  }
  this->end = local_130;
  Structure::operator=(&this->Conf,(Structure *)params_local);
  Structure::mark_loop_regions(&this->Conf,&local_20->starts,&local_20->ends);
  Structure::mark_loop_regions(&this->Conf,&local_20->starts_mask,&local_20->ends_mask);
  std::__cxx11::string::operator=((string *)&this->prot_name,(string *)&local_20->prot_name);
  this->rand_seed = local_20->rand_seed;
  this->num_conf = local_20->num_conf;
  this->ang_type = local_20->ang_type;
  this->should_close = (bool)(local_20->should_close & 1);
  this->num_dist_states = local_20->num_dist_states;
  this->num_sc_states = local_20->num_sc_states;
  this->conf_keep = local_20->conf_keep;
  this->outputconf = local_20->output_pdb;
  this->max_num_bb_clashes = local_20->max_num_bb_clashes;
  this->max_num_sc_clashes = local_20->max_num_sc_clashes;
  this->max_muloop_restart = local_20->max_muloop_restart;
  this->max_frag_checks = local_20->max_frag_checks;
  this->use_multiloop_lib = (bool)(local_20->use_multiloop_lib & 1);
  this->use_rot_lib = (bool)(local_20->use_rot_lib & 1);
  std::vector<int,_std::allocator<int>_>::operator=(&this->starts,&local_20->starts);
  std::vector<int,_std::allocator<int>_>::operator=(&this->ends,&local_20->ends);
  CollisionFrontend::init(&this->cfe,(EVP_PKEY_CTX *)&this->Conf);
  init_REDCELL(this,local_20);
  Structure::operator=(&this->_conf,&this->Conf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"data/BBT_phi_psi_pair_NEW.txt",&local_51);
  simpBBT_Init(this,(string *)local_50);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  if (0 < local_20->num_dist_states) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"data/frag.N.C_pdf_32_19.txt",&local_79);
    fragdis(this,(string *)local_78,0);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"data/frag.C.CA_pdf_32_19.txt",&local_a1);
    fragdis(this,(string *)local_a0,1);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"data/LoopGeo_37_pdf_21.txt",&local_c9);
    geometryinfo(this,(string *)local_c8);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  }
  return;
}

Assistant:

SMC::SMC(const Structure &nativeConf, const struct Params &params) {
    this->NumClosedconf = 0;

    this->Conf.init(nativeConf._numRes);
    this->_conf.init(nativeConf._numRes);

    //////////////////////////////////////////////////////////////////////////

    // Set start and ending positions for fragment to be regrown (only for smc)
    this->start = (params.starts[0] == -1) ? 1 : params.starts[0];
    this->end = (params.ends[0] == -1) ? nativeConf._numRes : params.ends[0];
    this->Conf = nativeConf;
    
    // Make sure regions which need to be grown are marked in some fashion
    // to avoid inclusion in potential energy calculations
    this->Conf.mark_loop_regions(params.starts, params.ends);
    // Also mark the mask regions in the same fashion
    this->Conf.mark_loop_regions(params.starts_mask, params.ends_mask);

    // @TODO - store params structure and provide read-only accessors
    this->prot_name = params.prot_name;
    this->rand_seed = params.rand_seed;
    this->num_conf = params.num_conf;
    this->ang_type = params.ang_type;
    this->should_close = params.should_close;
    this->num_dist_states = params.num_dist_states;
    this->num_sc_states = params.num_sc_states;
    this->conf_keep = params.conf_keep;
    this->outputconf = params.output_pdb;
    this->max_num_bb_clashes = params.max_num_bb_clashes;
    this->max_num_sc_clashes = params.max_num_sc_clashes;
    this->max_muloop_restart = params.max_muloop_restart;
    this->max_frag_checks = params.max_frag_checks;
    this->use_multiloop_lib = params.use_multiloop_lib;
    this->use_rot_lib = params.use_rot_lib;
    this->starts = params.starts;
    this->ends = params.ends;

    // Initialize collision checks for static geometry
    this->cfe.init(this->Conf, params);
    
    // Initialize ellipsoid criterion
    this->init_REDCELL(params);

    // Initialize conformation to be grown with template
    this->_conf = this->Conf;

    // bbt torsion angle for joint prob sampling
    this->simpBBT_Init("data/BBT_phi_psi_pair_NEW.txt");
    if (params.num_dist_states > 0) {
        // Load fragment end-to-end distance distributions
        // Initialize conditional distributions for C and N selection
        this->fragdis(FILE_FRAG_N_C, 0);
        this->fragdis(FILE_FRAG_C_CA, 1);
        this->geometryinfo(FILE_LOOPGEO);
    }
}